

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O1

PublicPrivateRequiredPair libcellml::publicAndOrPrivateInterfaceTypeRequired(VariablePtr *variable)

{
  bool bVar1;
  PublicPrivateRequiredPair PVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  ParentedEntityPtr componentOfVariable;
  ParentedEntityPtr componentOfEquivalentVariable;
  VariablePtr equivalentVariable;
  ParentedEntity local_60;
  ParentedEntity local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  sVar3 = Variable::equivalentVariableCount
                    ((variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)
                     ._M_ptr);
  if (sVar3 == 0) {
    PVar2.first = false;
    PVar2.second = false;
  }
  else {
    uVar7 = 1;
    bVar4 = false;
    bVar5 = false;
    bVar6 = false;
    while( true ) {
      Variable::equivalentVariable
                ((Variable *)&stack0xffffffffffffffc0,
                 (size_t)(variable->
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                );
      ParentedEntity::parent(&local_60);
      ParentedEntity::parent(&local_50);
      if (local_50.super_Entity._vptr_Entity == (_func_int **)0x0) {
        bVar1 = false;
      }
      else {
        bVar1 = areEntitiesSiblings((ParentedEntityPtr *)&local_60,(ParentedEntityPtr *)&local_50);
        if ((bVar1) ||
           (bVar1 = isEntityChildOf((ParentedEntityPtr *)&local_60,(ParentedEntityPtr *)&local_50),
           bVar1)) {
          bVar1 = true;
          bVar4 = true;
        }
        else {
          bVar1 = isEntityChildOf((ParentedEntityPtr *)&local_50,(ParentedEntityPtr *)&local_60);
          bVar6 = bVar5;
          if (bVar1) {
            bVar5 = true;
            bVar6 = true;
          }
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.super_Entity.mPimpl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.super_Entity.mPimpl);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.super_Entity.mPimpl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.super_Entity.mPimpl);
      }
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      if (bVar1 == false) break;
      sVar3 = Variable::equivalentVariableCount
                        ((variable->
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                        );
      if ((sVar3 <= uVar7) || (uVar7 = uVar7 + 1, (bVar4 & bVar6) != 0)) goto LAB_002665a2;
    }
    bVar6 = false;
    bVar4 = false;
LAB_002665a2:
    PVar2.second = bVar6;
    PVar2.first = bVar4;
  }
  return PVar2;
}

Assistant:

PublicPrivateRequiredPair publicAndOrPrivateInterfaceTypeRequired(const VariablePtr &variable)
{
    PublicPrivateRequiredPair pair = std::make_pair(false, false);
    for (size_t index = 0; index < variable->equivalentVariableCount() && !(pair.first && pair.second); ++index) {
        auto equivalentVariable = variable->equivalentVariable(index);
        auto componentOfVariable = variable->parent();
        auto componentOfEquivalentVariable = equivalentVariable->parent();
        if (componentOfEquivalentVariable == nullptr) {
            return std::make_pair(false, false);
        }
        if (areEntitiesSiblings(componentOfVariable, componentOfEquivalentVariable)
            || isEntityChildOf(componentOfVariable, componentOfEquivalentVariable)) {
            pair.first = true;
        } else if (isEntityChildOf(componentOfEquivalentVariable, componentOfVariable)) {
            pair.second = true;
        } else {
            return std::make_pair(false, false);
        }
    }
    return pair;
}